

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O0

float basisu::gauss(int x,int y,float sigma_sqr)

{
  int in_ESI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float g;
  float pow;
  
  fVar1 = expf(-((float)(in_EDI * in_EDI + in_ESI * in_ESI) / (in_XMM0_Da * 2.0)));
  fVar2 = sqrtf(in_XMM0_Da * 6.2831855);
  return (1.0 / fVar2) * fVar1;
}

Assistant:

float gauss(int x, int y, float sigma_sqr)
	{
		float pow = expf(-((x * x + y * y) / (2.0f * sigma_sqr)));
		float g = (1.0f / (sqrtf((float)(2.0f * M_PI * sigma_sqr)))) * pow;
		return g;
	}